

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_consumer.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_consume_message
          (amqp_connection_state_t state,amqp_envelope_t *envelope,timeval *timeout,int flags)

{
  amqp_bytes_t src;
  amqp_bytes_t bytes;
  amqp_bytes_t bytes_00;
  amqp_bytes_t bytes_01;
  int iVar1;
  undefined2 *in_RDX;
  amqp_connection_state_t in_RDI;
  amqp_bytes_t aVar2;
  amqp_bytes_t aVar3;
  amqp_basic_deliver_t *delivery_method;
  amqp_frame_t frame;
  int res;
  size_t in_stack_ffffffffffffff28;
  amqp_frame_t *in_stack_ffffffffffffff30;
  undefined2 *puVar4;
  amqp_connection_state_t in_stack_ffffffffffffff38;
  undefined2 *puVar5;
  amqp_frame_t *in_stack_ffffffffffffff40;
  amqp_connection_state_t state_00;
  amqp_pool_table_entry_t *local_a8;
  amqp_pool_table_entry_t *local_a0;
  amqp_pool_table_entry_t *local_98;
  amqp_pool_table_entry_t *local_90;
  size_t local_88;
  void *local_80;
  size_t local_78;
  void *local_70;
  undefined1 auVar6 [12];
  amqp_channel_t channel;
  char in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined2 in_stack_ffffffffffffffb2;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  long local_40;
  
  state_00 = in_RDI;
  memset(in_RDI,0,0x20);
  memset(in_RDX,0,0x160);
  iVar1 = amqp_simple_wait_frame_noblock
                    (state_00,in_stack_ffffffffffffff40,(timeval *)in_stack_ffffffffffffff38);
  if (iVar1 == 0) {
    if ((in_stack_ffffffffffffffb0 == '\x01') && (local_48 == 0x3c003c)) {
      *in_RDX = in_stack_ffffffffffffffb2;
      aVar2.bytes = in_RDX;
      aVar2.len = in_stack_ffffffffffffff28;
      puVar4 = in_RDX;
      aVar2 = amqp_bytes_malloc_dup(aVar2);
      *(size_t *)(puVar4 + 4) = aVar2.len;
      *(void **)(puVar4 + 8) = aVar2.bytes;
      *(undefined8 *)(in_RDX + 0xc) = *(undefined8 *)(local_40 + 0x10);
      *(undefined4 *)(in_RDX + 0x10) = *(undefined4 *)(local_40 + 0x18);
      aVar3.bytes = puVar4;
      aVar3.len = in_stack_ffffffffffffff28;
      puVar5 = in_RDX;
      aVar3 = amqp_bytes_malloc_dup(aVar3);
      channel = (amqp_channel_t)((ulong)local_40 >> 0x30);
      auVar6 = aVar2._4_12_;
      local_78 = aVar3.len;
      *(size_t *)(puVar5 + 0x14) = local_78;
      local_70 = aVar3.bytes;
      *(void **)(puVar5 + 0x18) = local_70;
      src.bytes = puVar4;
      src.len = in_stack_ffffffffffffff28;
      puVar5 = in_RDX;
      aVar2 = amqp_bytes_malloc_dup(src);
      local_88 = aVar2.len;
      *(size_t *)(puVar5 + 0x1c) = local_88;
      local_80 = aVar2.bytes;
      *(void **)(puVar5 + 0x20) = local_80;
      iVar1 = amqp_bytes_malloc_dup_failed(*(amqp_bytes_t *)(in_RDX + 4));
      if (((iVar1 == 0) &&
          (iVar1 = amqp_bytes_malloc_dup_failed(*(amqp_bytes_t *)(in_RDX + 0x14)), iVar1 == 0)) &&
         (iVar1 = amqp_bytes_malloc_dup_failed(*(amqp_bytes_t *)(in_RDX + 0x1c)), iVar1 == 0)) {
        amqp_read_message((amqp_connection_state_t)
                          CONCAT44(in_stack_ffffffffffffffb4,
                                   CONCAT22(in_stack_ffffffffffffffb2,
                                            CONCAT11(in_stack_ffffffffffffffb1,
                                                     in_stack_ffffffffffffffb0))),channel,
                          auVar6._4_8_,auVar6._0_4_);
        state_00->pool_table[0] = local_a8;
        state_00->pool_table[1] = local_a0;
        state_00->pool_table[2] = local_98;
        state_00->pool_table[3] = local_90;
        if (*(int *)state_00->pool_table == 1) {
          *(undefined4 *)state_00->pool_table = 1;
          return (amqp_rpc_reply_t *)in_RDI;
        }
      }
      else {
        *(undefined4 *)state_00->pool_table = 2;
        *(undefined4 *)(state_00->pool_table + 3) = 0xffffffff;
      }
      bytes.bytes = puVar4;
      bytes.len = in_stack_ffffffffffffff28;
      amqp_bytes_free(bytes);
      bytes_00.bytes = puVar4;
      bytes_00.len = in_stack_ffffffffffffff28;
      amqp_bytes_free(bytes_00);
      bytes_01.bytes = puVar4;
      bytes_01.len = in_stack_ffffffffffffff28;
      amqp_bytes_free(bytes_01);
    }
    else {
      amqp_put_back_frame(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      *(undefined4 *)state_00->pool_table = 2;
      *(undefined4 *)(state_00->pool_table + 3) = 0xfffffff0;
    }
  }
  else {
    *(undefined4 *)state_00->pool_table = 2;
    *(int *)(state_00->pool_table + 3) = iVar1;
  }
  return (amqp_rpc_reply_t *)in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_consume_message(amqp_connection_state_t state,
                                      amqp_envelope_t *envelope,
                                      const struct timeval *timeout,
                                      AMQP_UNUSED int flags) {
  int res;
  amqp_frame_t frame;
  amqp_basic_deliver_t *delivery_method;
  amqp_rpc_reply_t ret;

  memset(&ret, 0, sizeof(ret));
  memset(envelope, 0, sizeof(*envelope));

  res = amqp_simple_wait_frame_noblock(state, &frame, timeout);
  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    goto error_out1;
  }

  if (AMQP_FRAME_METHOD != frame.frame_type ||
      AMQP_BASIC_DELIVER_METHOD != frame.payload.method.id) {
    amqp_put_back_frame(state, &frame);
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;
    goto error_out1;
  }

  delivery_method = frame.payload.method.decoded;

  envelope->channel = frame.channel;
  envelope->consumer_tag = amqp_bytes_malloc_dup(delivery_method->consumer_tag);
  envelope->delivery_tag = delivery_method->delivery_tag;
  envelope->redelivered = delivery_method->redelivered;
  envelope->exchange = amqp_bytes_malloc_dup(delivery_method->exchange);
  envelope->routing_key = amqp_bytes_malloc_dup(delivery_method->routing_key);

  if (amqp_bytes_malloc_dup_failed(envelope->consumer_tag) ||
      amqp_bytes_malloc_dup_failed(envelope->exchange) ||
      amqp_bytes_malloc_dup_failed(envelope->routing_key)) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_NO_MEMORY;
    goto error_out2;
  }

  ret = amqp_read_message(state, envelope->channel, &envelope->message, 0);
  if (AMQP_RESPONSE_NORMAL != ret.reply_type) {
    goto error_out2;
  }

  ret.reply_type = AMQP_RESPONSE_NORMAL;
  return ret;

error_out2:
  amqp_bytes_free(envelope->routing_key);
  amqp_bytes_free(envelope->exchange);
  amqp_bytes_free(envelope->consumer_tag);
error_out1:
  return ret;
}